

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O1

int wc_match_inner(char *wildcard,char *target,size_t target_len)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *target_end;
  char *local_48;
  char *local_40;
  int local_34;
  
  target_end = target + target_len;
  local_48 = wildcard;
  local_40 = target;
  if ((*wildcard == '*') ||
     (uVar4 = wc_match_fragment(&local_48,&local_40,target_end), 0 < (int)uVar4)) {
    while (*local_48 == '*') {
      for (; *local_48 == '*'; local_48 = local_48 + 1) {
      }
      if (*local_48 == '\0') {
        return 1;
      }
      if (*local_40 == '\0') {
        bVar1 = false;
      }
      else {
        do {
          pcVar3 = local_40;
          pcVar2 = local_48;
          iVar5 = wc_match_fragment(&local_48,&local_40,target_end);
          if (iVar5 < 0) {
            iVar6 = 1;
            local_34 = iVar5;
          }
          else if (iVar5 == 0) {
            local_40 = local_40 + 1;
            iVar6 = 0;
          }
          else {
            iVar6 = 7;
            if ((*local_48 == '\0') && (local_40 != target_end)) {
              local_40 = target_end + ((long)pcVar3 - (long)local_40);
              local_48 = pcVar2;
              local_34 = wc_match_fragment(&local_48,&local_40,target_end);
              iVar6 = 1;
            }
          }
          if (iVar6 != 0) {
            if (iVar6 != 7) {
              return local_34;
            }
            break;
          }
        } while (*local_40 != '\0');
        bVar1 = 0 < iVar5;
      }
      if (!bVar1) {
        return 0;
      }
    }
    if (*local_48 != '\0') {
      __assert_fail("*wildcard == \'*\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/wildcard.c"
                    ,0xe4,"int wc_match_inner(const char *, const char *, size_t)");
    }
    uVar4 = (uint)(local_40 == target_end);
  }
  return uVar4;
}

Assistant:

static int wc_match_inner(
    const char *wildcard, const char *target, size_t target_len)
{
    const char *target_end = target + target_len;
    int ret;

    /*
     * Every time we see a '*' _followed_ by a fragment, we just
     * search along the string for a location at which the fragment
     * matches. The only special case is when we see a fragment
     * right at the start, in which case we just call the matching
     * routine once and give up if it fails.
     */
    if (*wildcard != '*') {
        ret = wc_match_fragment(&wildcard, &target, target_end);
        if (ret <= 0)
            return ret;                /* pass back failure or error alike */
    }

    while (*wildcard) {
        assert(*wildcard == '*');
        while (*wildcard == '*')
            wildcard++;

        /*
         * It's possible we've just hit the end of the wildcard
         * after seeing a *, in which case there's no need to
         * bother searching any more because we've won.
         */
        if (!*wildcard)
            return 1;

        /*
         * Now `wildcard' points at the next fragment. So we
         * attempt to match it against `target', and if that fails
         * we increment `target' and try again, and so on. When we
         * find we're about to try matching against the empty
         * string, we give up and return 0.
         */
        ret = 0;
        while (*target) {
            const char *save_w = wildcard, *save_t = target;

            ret = wc_match_fragment(&wildcard, &target, target_end);

            if (ret < 0)
                return ret;            /* syntax error */

            if (ret > 0 && !*wildcard && target != target_end) {
                /*
                 * Final special case - literally.
                 *
                 * This situation arises when we are matching a
                 * _terminal_ fragment of the wildcard (that is,
                 * there is nothing after it, e.g. "*a"), and it
                 * has matched _too early_. For example, matching
                 * "*a" against "parka" will match the "a" fragment
                 * against the _first_ a, and then (if it weren't
                 * for this special case) matching would fail
                 * because we're at the end of the wildcard but not
                 * at the end of the target string.
                 *
                 * In this case what we must do is measure the
                 * length of the fragment in the target (which is
                 * why we saved `target'), jump straight to that
                 * distance from the end of the string using
                 * strlen, and match the same fragment again there
                 * (which is why we saved `wildcard'). Then we
                 * return whatever that operation returns.
                 */
                target = target_end - (target - save_t);
                wildcard = save_w;
                return wc_match_fragment(&wildcard, &target, target_end);
            }

            if (ret > 0)
                break;
            target++;
        }
        if (ret > 0)
            continue;
        return 0;
    }

    /*
     * If we reach here, it must be because we successfully matched
     * a fragment and then found ourselves right at the end of the
     * wildcard. Hence, we return 1 if and only if we are also
     * right at the end of the target.
     */
    return target == target_end;
}